

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

JavascriptRegExp * Js::JavascriptRegExp::BoxStackInstance(JavascriptRegExp *instance,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *this;
  size_t sVar4;
  Recycler *pRVar5;
  JavascriptRegExp *this_00;
  TrackAllocData local_58;
  JavascriptRegExp *local_30;
  JavascriptRegExp *boxedInstance;
  JavascriptRegExp **boxedInstanceRef;
  JavascriptRegExp *pJStack_18;
  bool deepCopy_local;
  JavascriptRegExp *instance_local;
  
  boxedInstanceRef._7_1_ = deepCopy;
  pJStack_18 = instance;
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x429,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  boxedInstance = (JavascriptRegExp *)&pJStack_18[-1].lastIndexOrFlag;
  local_30 = *(JavascriptRegExp **)boxedInstance;
  instance_local = local_30;
  if (local_30 == (JavascriptRegExp *)0x0) {
    this = DynamicObject::GetTypeHandler(&pJStack_18->super_DynamicObject);
    sVar4 = DynamicTypeHandler::GetInlineSlotsSize(this);
    if (sVar4 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                  ,0x431,"(instance->GetTypeHandler()->GetInlineSlotsSize() == 0)",
                                  "instance->GetTypeHandler()->GetInlineSlotsSize() == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)pJStack_18);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
               ,0x432);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_58);
    this_00 = (JavascriptRegExp *)new<Memory::Recycler>(0x40,pRVar5,0x43c4b0);
    JavascriptRegExp(this_00,pJStack_18,(bool)(boxedInstanceRef._7_1_ & 1));
    (boxedInstance->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)this_00;
    instance_local = this_00;
  }
  return instance_local;
}

Assistant:

JavascriptRegExp * JavascriptRegExp::BoxStackInstance(JavascriptRegExp * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        // On the stack, the we reserved a pointer before the object as to store the boxed value
        JavascriptRegExp ** boxedInstanceRef = ((JavascriptRegExp **)instance) - 1;
        JavascriptRegExp * boxedInstance = *boxedInstanceRef;
        if (boxedInstance)
        {
            return boxedInstance;
        }
        Assert(instance->GetTypeHandler()->GetInlineSlotsSize() == 0);
        boxedInstance = RecyclerNew(instance->GetRecycler(), JavascriptRegExp, instance, deepCopy);
        *boxedInstanceRef = boxedInstance;
        return boxedInstance;
    }